

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cab.c
# Opt level: O0

uint32_t cab_checksum_cfdata(void *p,size_t bytes,uint32_t seed)

{
  uint32_t uVar1;
  uint uVar2;
  byte *pbVar3;
  byte *pbVar4;
  ulong in_RSI;
  long in_RDI;
  uint32_t t;
  uint32_t sum;
  uchar *b;
  undefined8 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  uint uVar5;
  undefined4 in_stack_ffffffffffffffdc;
  void *in_stack_ffffffffffffffe0;
  
  uVar1 = cab_checksum_cfdata_4
                    (in_stack_ffffffffffffffe0,
                     CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                     (uint32_t)((ulong)in_stack_ffffffffffffffd0 >> 0x20));
  pbVar3 = (byte *)(in_RDI + (in_RSI & 0xfffffffffffffffc));
  uVar5 = 0;
  uVar2 = (uint)in_RSI & 3;
  if (uVar2 != 1) {
    pbVar4 = pbVar3;
    if (uVar2 != 2) {
      if (uVar2 != 3) goto LAB_002535fe;
      pbVar4 = pbVar3 + 1;
      uVar5 = (uint)*pbVar3 << 0x10;
    }
    pbVar3 = pbVar4 + 1;
    uVar5 = (uint)*pbVar4 << 8 | uVar5;
  }
  uVar5 = *pbVar3 | uVar5;
LAB_002535fe:
  return uVar5 ^ uVar1;
}

Assistant:

static uint32_t
cab_checksum_cfdata(const void *p, size_t bytes, uint32_t seed)
{
	const unsigned char *b;
	uint32_t sum;
	uint32_t t;

	sum = cab_checksum_cfdata_4(p, bytes, seed);
	b = p;
	b += bytes & ~3;
	t = 0;
	switch (bytes & 3) {
	case 3:
		t |= ((uint32_t)(*b++)) << 16;
		/* FALL THROUGH */
	case 2:
		t |= ((uint32_t)(*b++)) << 8;
		/* FALL THROUGH */
	case 1:
		t |= *b;
		/* FALL THROUGH */
	default:
		break;
	}
	sum ^= t;

	return (sum);
}